

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_2_ool_sparc
               (TCGContext_conflict7 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz,int32_t data,gen_helper_gvec_2_conflict7 *fn)

{
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o;
  
  val = simd_desc_sparc(oprsz,maxsz,data);
  pTVar1 = tcg_const_i32_sparc(tcg_ctx,val);
  ts = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_sparc
            (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_i64_sparc
            (tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)aofs)
  ;
  (*fn)(tcg_ctx,(TCGv_ptr)((long)ts - (long)tcg_ctx),(TCGv_ptr)((long)ts_00 - (long)tcg_ctx),pTVar1)
  ;
  tcg_temp_free_internal_sparc(tcg_ctx,ts);
  tcg_temp_free_internal_sparc(tcg_ctx,ts_00);
  tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_2_ool(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs,
                        uint32_t oprsz, uint32_t maxsz, int32_t data,
                        gen_helper_gvec_2 *fn)
{
    TCGv_ptr a0, a1;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);

    fn(tcg_ctx, a0, a1, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_i32(tcg_ctx, desc);
}